

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O3

bool __thiscall Time::step(Time *this)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  
  do {
    iVar4 = (int)((ulong)((long)(this->timeObjects).
                                super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->timeObjects).
                               super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar4 == 0) goto LAB_0014a425;
    bVar3 = 1;
    bVar5 = 0;
    do {
      iVar4 = iVar4 + -1;
      iVar2 = (*(this->timeObjects).
                super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                super__Vector_impl_data._M_start[iVar4]->_vptr_TimeDependent[5])();
      if ((char)iVar2 == '\0') {
        (*(this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar4]->_vptr_TimeDependent[3])();
        iVar2 = (*(this->timeObjects).
                  super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4]->_vptr_TimeDependent[5])();
        bVar5 = bVar5 | (byte)iVar2;
        bVar3 = bVar3 & (byte)iVar2;
      }
    } while (iVar4 != 0);
  } while ((~bVar5 & 1) == 0 && bVar3 == 0);
  if (bVar3 == 0) {
    bVar1 = false;
  }
  else {
LAB_0014a425:
    this->timePassed = this->dt + this->timePassed;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Time::step()
{
	// saving flags for update success
	bool someObjectsUpdated = true;
	bool allObjectsUpdated = false;
		
	// while some objects are waiting, but some can still be updated
	while (someObjectsUpdated && !allObjectsUpdated) {
		someObjectsUpdated = false;
		allObjectsUpdated = true;
		
		// try to update all waiting objects
		for (int i=timeObjects.size()-1; i+1; --i) {
			if (!timeObjects[i]->isNextStatePrepared()) {
				
				// update object
				timeObjects[i]->prepareNextState();
				
				// record success of updating
				if (timeObjects[i]->isNextStatePrepared())
					someObjectsUpdated = true;
				else
					allObjectsUpdated = false;
			}
		}
	}
	
	if (allObjectsUpdated)
		timePassed += dt;
	
	return allObjectsUpdated;
}